

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O3

FunctionBody * __thiscall Js::Utf8SourceInfo::FindFunction(Utf8SourceInfo *this,LocalFunctionId id)

{
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  FunctionBody *pFVar1;
  FunctionBody *local_20;
  FunctionBody *matchedFunctionBody;
  LocalFunctionId id_local;
  
  local_20 = (FunctionBody *)0x0;
  this_00 = (this->functionBodyDictionary).ptr;
  if ((this_00 ==
       (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
        *)0x0) ||
     (matchedFunctionBody._4_4_ = id,
     JsUtil::
     BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
     ::TryGetValue<unsigned_int>
               (&this_00->
                 super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ,(uint *)((long)&matchedFunctionBody + 4),&local_20),
     local_20 == (FunctionBody *)0x0)) {
    pFVar1 = (FunctionBody *)0x0;
  }
  else {
    pFVar1 = (FunctionBody *)0x0;
    if ((local_20->field_0x17b & 0x40) == 0) {
      pFVar1 = local_20;
    }
  }
  return pFVar1;
}

Assistant:

Js::FunctionBody* Utf8SourceInfo::FindFunction(Js::LocalFunctionId id) const
    {
        Js::FunctionBody *matchedFunctionBody = nullptr;

        if (this->functionBodyDictionary)
        {
            // Ignore return value - OK if function is not found.
            this->functionBodyDictionary->TryGetValue(id, &matchedFunctionBody);

            if (matchedFunctionBody == nullptr || matchedFunctionBody->IsPartialDeserializedFunction())
            {
                return nullptr;
            }
        }

        return matchedFunctionBody;
    }